

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec75.c
# Opt level: O1

int Dau_DsdCheckDecAndExist_rec(char *pStr,char **p,int *pMatches,int *pnSupp)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  ulong *pnSupp_00;
  byte *pbVar12;
  int uSupp;
  ulong local_58 [5];
  
  if (**p == '!') {
    *p = *p + 1;
  }
  pbVar4 = (byte *)*p;
  bVar1 = *pbVar4;
  if ((byte)(bVar1 + 0xbf) < 6 || (byte)(bVar1 - 0x30) < 10) {
    do {
      pbVar4 = pbVar4 + 1;
      *p = (char *)pbVar4;
      bVar1 = *pbVar4;
    } while ((byte)(bVar1 - 0x30) < 10 || (byte)(bVar1 + 0xbf) < 6);
  }
  if ((byte)(bVar1 + 0x9f) < 0x1a) {
    *pnSupp = *pnSupp + 1;
    uVar6 = 0;
  }
  else if ((bVar1 - 0x3c < 0x40) &&
          ((0x8000000080000001U >> ((ulong)(bVar1 - 0x3c) & 0x3f) & 1) != 0)) {
    if ((int)(char)bVar1 + (uint)(bVar1 != 0x28) + 1 !=
        (int)pStr[pMatches[(long)pbVar4 - (long)pStr]]) {
      __assert_fail("*q == **p + 1 + (**p != \'(\')",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                    ,0xac,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
    }
    pbVar12 = (byte *)(pStr + pMatches[(long)pbVar4 - (long)pStr]);
    pbVar4 = pbVar4 + 1;
    *p = (char *)pbVar4;
    uVar6 = 0;
    if (pbVar4 < pbVar12) {
      uVar6 = 0;
      do {
        local_58[0] = local_58[0] & 0xffffffff00000000;
        uVar2 = Dau_DsdCheckDecAndExist_rec(pStr,p,pMatches,(int *)local_58);
        uVar6 = uVar6 | uVar2;
        *pnSupp = *pnSupp + (int)local_58[0];
        pbVar4 = (byte *)(*p + 1);
        *p = (char *)pbVar4;
      } while (pbVar4 < pbVar12);
    }
    if (pbVar4 != pbVar12) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                    ,0xb3,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
    }
  }
  else {
    if (bVar1 != 0x28) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                    ,0xb6,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
    }
    local_58[2] = 0;
    local_58[3] = 0;
    local_58[0] = 0;
    local_58[1] = 0;
    if (pStr[pMatches[(long)pbVar4 - (long)pStr]] != ')') {
      __assert_fail("*q == **p + 1 + (**p != \'(\')",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                    ,0x8b,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
    }
    pbVar12 = (byte *)(pStr + pMatches[(long)pbVar4 - (long)pStr]);
    pbVar4 = pbVar4 + 1;
    *p = (char *)pbVar4;
    uVar2 = 0;
    uVar11 = 0;
    uVar6 = 0;
    if (pbVar4 < pbVar12) {
      pnSupp_00 = local_58;
      uVar2 = 0;
      uVar11 = 0;
      do {
        uVar3 = Dau_DsdCheckDecAndExist_rec(pStr,p,pMatches,(int *)pnSupp_00);
        uVar6 = uVar6 | uVar3;
        uVar9 = *pnSupp_00;
        *pnSupp = *pnSupp + (int)uVar9;
        uVar11 = uVar11 + ((int)uVar9 == 1);
        pbVar4 = (byte *)(*p + 1);
        *p = (char *)pbVar4;
        pnSupp_00 = (ulong *)((long)pnSupp_00 + 4);
        uVar2 = uVar2 + 1;
      } while (pbVar4 < pbVar12);
    }
    if (pbVar4 != pbVar12) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                    ,0x92,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
    }
    if (uVar2 < 2) {
      __assert_fail("nParts > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                    ,0x93,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
    }
    if (uVar11 != 0) {
      uVar3 = 1;
      uVar5 = 1 << ((byte)uVar2 & 0x1f);
      if (1 < (int)uVar5) {
        do {
          uVar9 = 0;
          uVar7 = 0;
          do {
            iVar10 = *(int *)((long)local_58 + uVar9 * 4);
            if (1 < iVar10) {
              if ((uVar3 >> ((uint)uVar9 & 0x1f) & 1) == 0) {
                iVar10 = 0;
              }
              uVar7 = uVar7 + iVar10;
            }
            uVar9 = uVar9 + 1;
          } while (uVar2 != uVar9);
          if (8 < (int)uVar7) {
            __assert_fail("Sum <= 8",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                          ,0x9d,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
          }
          uVar8 = uVar11;
          if (1 < (int)uVar7) {
            do {
              uVar6 = uVar6 | 1 << (uVar7 & 0x1f);
              uVar7 = uVar7 + 1;
              uVar8 = uVar8 - 1;
            } while (uVar8 != 0);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != uVar5);
      }
      if (2 < uVar11) {
        uVar2 = 2;
        do {
          uVar6 = uVar6 | 1 << (uVar2 & 0x1f);
          uVar2 = uVar2 + 1;
        } while (uVar11 != uVar2);
      }
    }
  }
  return uVar6;
}

Assistant:

int Dau_DsdCheckDecAndExist_rec( char * pStr, char ** p, int * pMatches, int * pnSupp )
{
    if ( **p == '!' )
        (*p)++;
    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
        (*p)++;
    if ( **p >= 'a' && **p <= 'z' ) // var
    {
        (*pnSupp)++;
        return 0;
    }
    if ( **p == '(' ) // and
    {
        unsigned Mask = 0;
        int m, i, pSupps[8] = {0}, nParts = 0, nSimple = 0, nMints;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Mask |= Dau_DsdCheckDecAndExist_rec( pStr, p, pMatches, &pSupps[nParts] );
            nSimple += (pSupps[nParts] == 1);
            *pnSupp += pSupps[nParts++];
        }
        assert( *p == q );
        assert( nParts > 1 );
        if ( nSimple > 0 )
        {
            nMints = (1 << nParts);
            for ( m = 1; m < nMints; m++ )
            {
                int Sum = 0;
                for ( i = 0; i < nParts; i++ )
                    if ( pSupps[i] > 1 && ((m >> i) & 1) )
                        Sum += pSupps[i];
                assert( Sum <= 8 );
                if ( Sum >= 2 )
                    for ( i = 0; i < nSimple; i++ )
                        Mask |= (1 << (Sum + i));
            }
            for ( i = 2; i < nSimple; i++ )
                Mask |= (1 << i);
        }
        return Mask;
    }
    if ( **p == '<' || **p == '{' || **p == '[' ) // mux/xor/nondec
    {
        int uSupp;
        unsigned Mask = 0;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            uSupp = 0;
            Mask |= Dau_DsdCheckDecAndExist_rec( pStr, p, pMatches, &uSupp );
            *pnSupp += uSupp;
        }
        assert( *p == q );
        return Mask;
    }
    assert( 0 );
    return 0;
}